

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_node pugi::impl::anon_unknown_0::xpath_first(xpath_node *begin,xpath_node *end,type_t type)

{
  bool bVar1;
  xml_node xVar2;
  xpath_node *pxVar3;
  undefined4 in_register_00000014;
  xpath_node *extraout_RDX;
  xml_attribute xVar4;
  xml_attribute *pxVar5;
  xpath_node *this;
  xpath_node xVar6;
  
  pxVar3 = (xpath_node *)CONCAT44(in_register_00000014,type);
  if (begin == end) {
    return (xpath_node)ZEXT816(0);
  }
  if (type == type_unsorted) {
    this = begin + 1;
    for (; this != end; this = this + 1) {
      bVar1 = document_order_comparator::operator()((document_order_comparator *)this,begin,pxVar3);
      pxVar3 = this;
      if (!bVar1) {
        pxVar3 = begin;
      }
      begin = pxVar3;
      pxVar3 = extraout_RDX;
    }
    pxVar5 = &begin->_attribute;
  }
  else if (type == type_sorted_reverse) {
    begin = end + -1;
    pxVar5 = &end[-1]._attribute;
  }
  else {
    if (type != type_sorted) {
      xVar4._attr = (xml_attribute_struct *)0x0;
      xVar2._root = (xml_node_struct *)0x0;
      goto LAB_0011b0f2;
    }
    pxVar5 = &begin->_attribute;
  }
  xVar2._root = (begin->_node)._root;
  xVar4._attr = pxVar5->_attr;
LAB_0011b0f2:
  xVar6._attribute._attr = xVar4._attr;
  xVar6._node._root = xVar2._root;
  return xVar6;
}

Assistant:

PUGI__FN xpath_node xpath_first(const xpath_node* begin, const xpath_node* end, xpath_node_set::type_t type)
	{
		if (begin == end) return xpath_node();

		switch (type)
		{
		case xpath_node_set::type_sorted:
			return *begin;

		case xpath_node_set::type_sorted_reverse:
			return *(end - 1);

		case xpath_node_set::type_unsorted:
			return *min_element(begin, end, document_order_comparator());

		default:
			assert(false && "Invalid node set type"); // unreachable
			return xpath_node();
		}
	}